

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalGenerator::ResolveLanguageCompiler
          (cmGlobalGenerator *this,string *lang,cmMakefile *mf,bool optional)

{
  pointer pbVar1;
  cmState *pcVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  char *in_name;
  string changeVars;
  string cnameString;
  string langComp;
  string pathString;
  string path;
  string local_f8;
  undefined1 local_d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  string local_90;
  string local_70;
  char *local_50;
  char *local_48;
  char local_40;
  undefined7 uStack_3f;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CMAKE_","");
  std::__cxx11::string::_M_append((char *)&local_90,(ulong)(lang->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)&local_90);
  pcVar6 = cmMakefile::GetDefinition(mf,&local_90);
  if (pcVar6 == (char *)0x0) {
    if (!optional) {
      cmSystemTools::Error
                (local_90._M_dataplus._M_p," not set, after EnableLanguage",(char *)0x0,(char *)0x0)
      ;
    }
    goto LAB_00399fd0;
  }
  in_name = cmMakefile::GetRequiredDefinition(mf,&local_90);
  local_48 = (char *)0x0;
  local_40 = '\0';
  local_50 = &local_40;
  bVar4 = cmsys::SystemTools::FileIsFullPath(in_name);
  pcVar6 = local_48;
  if (bVar4) {
    strlen(in_name);
    std::__cxx11::string::_M_replace((ulong)&local_50,0,pcVar6,(ulong)in_name);
  }
  else {
    local_b8._M_allocated_capacity = 0;
    local_b8._8_8_ = (char *)0x0;
    local_a8._M_allocated_capacity = 0;
    cmsys::SystemTools::FindProgram
              (&local_f8,in_name,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_b8,false);
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,
                      CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                               local_f8.field_2._M_local_buf[0]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_b8);
  }
  if (local_48 == (char *)0x0) {
    if (optional) goto LAB_00399d13;
  }
  else {
    bVar4 = cmsys::SystemTools::FileExists(local_50);
    if (bVar4 || optional) {
LAB_00399d13:
      pcVar6 = cmState::GetInitializedCacheValue(this->CMakeInstance->State,&local_90);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      local_f8._M_string_length = 0;
      local_f8.field_2._M_local_buf[0] = '\0';
      if (pcVar6 != (char *)0x0 && !optional) {
        local_b8._M_allocated_capacity = (size_type)&local_a8;
        local_b8._8_8_ = (char *)0x0;
        local_a8._M_allocated_capacity = local_a8._M_allocated_capacity & 0xffffffffffffff00;
        bVar4 = cmsys::SystemTools::FileIsFullPath(pcVar6);
        uVar3 = local_b8._8_8_;
        if (bVar4) {
          strlen(pcVar6);
          std::__cxx11::string::_M_replace((ulong)&local_b8,0,(char *)uVar3,(ulong)pcVar6);
        }
        else {
          local_d8._0_8_ = (pointer)0x0;
          local_d8._8_8_ = (pointer)0x0;
          local_d8._16_8_ = (pointer)0x0;
          cmsys::SystemTools::FindProgram
                    (&local_70,pcVar6,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_d8,false);
          std::__cxx11::string::operator=((string *)local_b8._M_local_buf,(string *)&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_d8);
        }
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,local_50,local_48 + (long)local_50);
        cmsys::SystemTools::ConvertToUnixSlashes((string *)&local_b8);
        cmsys::SystemTools::ConvertToUnixSlashes(&local_70);
        if ((local_b8._8_8_ != local_70._M_string_length) ||
           (((char *)local_b8._8_8_ != (char *)0x0 &&
            (iVar5 = bcmp((void *)local_b8._M_allocated_capacity,local_70._M_dataplus._M_p,
                          local_b8._8_8_), iVar5 != 0)))) {
          pcVar2 = this->CMakeInstance->State;
          pbVar1 = (pointer)(local_d8 + 0x10);
          local_d8._0_8_ = pbVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_d8,"__CMAKE_DELETE_CACHE_CHANGE_VARS_","");
          pcVar6 = cmState::GetGlobalProperty(pcVar2,(string *)local_d8);
          if ((pointer)local_d8._0_8_ != pbVar1) {
            operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
          }
          if (pcVar6 != (char *)0x0) {
            std::__cxx11::string::append((char *)&local_f8);
            std::__cxx11::string::append((char *)&local_f8);
          }
          std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_90._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&local_f8);
          std::__cxx11::string::append((char *)&local_f8);
          pcVar2 = this->CMakeInstance->State;
          local_d8._0_8_ = pbVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_d8,"__CMAKE_DELETE_CACHE_CHANGE_VARS_","");
          cmState::SetGlobalProperty(pcVar2,(string *)local_d8,local_f8._M_dataplus._M_p);
          if ((pointer)local_d8._0_8_ != pbVar1) {
            operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_allocated_capacity != &local_a8) {
          operator_delete((void *)local_b8._M_allocated_capacity,local_a8._M_allocated_capacity + 1)
          ;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,
                        CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                 local_f8.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
LAB_00399fd0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalGenerator::ResolveLanguageCompiler(const std::string &lang,
                                                cmMakefile *mf,
                                                bool optional) const
{
  std::string langComp = "CMAKE_";
  langComp += lang;
  langComp += "_COMPILER";

  if(!mf->GetDefinition(langComp))
    {
    if(!optional)
      {
      cmSystemTools::Error(langComp.c_str(),
                           " not set, after EnableLanguage");
      }
    return;
    }
  const char* name = mf->GetRequiredDefinition(langComp);
  std::string path;
  if(!cmSystemTools::FileIsFullPath(name))
    {
    path = cmSystemTools::FindProgram(name);
    }
  else
    {
    path = name;
    }
  if((path.empty() || !cmSystemTools::FileExists(path.c_str()))
      && (optional==false))
    {
    return;
    }
  const char* cname = this->GetCMakeInstance()->
    GetState()->GetInitializedCacheValue(langComp);
  std::string changeVars;
  if(cname && !optional)
    {
    std::string cnameString;
    if(!cmSystemTools::FileIsFullPath(cname))
      {
      cnameString = cmSystemTools::FindProgram(cname);
      }
    else
      {
      cnameString = cname;
      }
    std::string pathString = path;
    // get rid of potentially multiple slashes:
    cmSystemTools::ConvertToUnixSlashes(cnameString);
    cmSystemTools::ConvertToUnixSlashes(pathString);
    if (cnameString != pathString)
      {
      const char* cvars =
        this->GetCMakeInstance()->GetState()->GetGlobalProperty(
          "__CMAKE_DELETE_CACHE_CHANGE_VARS_");
      if(cvars)
        {
        changeVars += cvars;
        changeVars += ";";
        }
      changeVars += langComp;
      changeVars += ";";
      changeVars += cname;
      this->GetCMakeInstance()->GetState()->SetGlobalProperty(
        "__CMAKE_DELETE_CACHE_CHANGE_VARS_",
        changeVars.c_str());
      }
    }
}